

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O2

void cfl_luma_subsampling_422_hbd_c
               (uint16_t *input,int input_stride,uint16_t *output_q3,int width,int height)

{
  int iVar1;
  int i;
  long lVar2;
  
  iVar1 = 0;
  if (height < 1) {
    height = iVar1;
  }
  for (; iVar1 != height; iVar1 = iVar1 + 1) {
    for (lVar2 = 0; lVar2 < width; lVar2 = lVar2 + 2) {
      *(uint16_t *)((long)output_q3 + lVar2) = (input[lVar2 + 1] + input[lVar2]) * 4;
    }
    output_q3 = output_q3 + 0x20;
    input = input + input_stride;
  }
  return;
}

Assistant:

static void cfl_luma_subsampling_422_hbd_c(const uint16_t *input,
                                           int input_stride,
                                           uint16_t *output_q3, int width,
                                           int height) {
  assert((height - 1) * CFL_BUF_LINE + width <= CFL_BUF_SQUARE);
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i += 2) {
      output_q3[i >> 1] = (input[i] + input[i + 1]) << 2;
    }
    input += input_stride;
    output_q3 += CFL_BUF_LINE;
  }
}